

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O3

adt_error_t adt_ary_splice(adt_ary_t *self,int32_t s32Index,int32_t s32Len)

{
  adt_error_t aVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void **__src;
  ulong uVar7;
  size_t __n;
  void **__dest;
  
  aVar1 = '\x01';
  if (0 < s32Len && self != (adt_ary_t *)0x0) {
    if (s32Index < 0) {
      iVar2 = self->s32CurLen;
      if (SBORROW4(iVar2,-s32Index) != iVar2 + s32Index < 0) {
        return '\x03';
      }
      s32Index = s32Index + iVar2;
    }
    else {
      iVar2 = self->s32CurLen;
      if (iVar2 <= s32Index) {
        return '\x03';
      }
    }
    iVar6 = s32Index + s32Len;
    aVar1 = '\x04';
    if (iVar6 <= iVar2) {
      if ((self->destructorEnable == true) && (self->pDestructor != (_func_void_void_ptr *)0x0)) {
        lVar3 = (long)s32Index;
        uVar7 = (ulong)(uint)s32Len;
        do {
          (*self->pDestructor)(self->pFirst[lVar3]);
          lVar3 = lVar3 + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        iVar2 = self->s32CurLen;
      }
      uVar4 = iVar2 - iVar6;
      if ((uVar4 != 0 && iVar6 <= iVar2) && (uVar5 = uVar4 * 8, (uVar4 & 0x1fffffff) != 0)) {
        __src = self->pFirst + iVar6;
        __dest = self->pFirst + s32Index;
        do {
          __n = 0x10000;
          if (uVar5 < 0x10000) {
            __n = (size_t)uVar5;
          }
          memmove(__dest,__src,__n);
          __dest = (void **)((long)__dest + __n);
          __src = (void **)((long)__src + __n);
          uVar5 = uVar5 - (int)__n;
        } while (uVar5 != 0);
        iVar2 = self->s32CurLen;
      }
      self->s32CurLen = iVar2 - s32Len;
      aVar1 = '\0';
    }
  }
  return aVar1;
}

Assistant:

adt_error_t adt_ary_splice(adt_ary_t *self,int32_t s32Index, int32_t s32Len){
   if ((self!=0) && (s32Len > 0)) {
      int32_t s32Source;
      int32_t s32Destination;
      int32_t i;
      int32_t s32ElemsRemain;


      if(s32Index<0){
         s32Index = (-s32Index);
         if(s32Index > (self->s32CurLen) ){
            return ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
         s32Index=self->s32CurLen-s32Index;
      }
      else if(s32Index >= self->s32CurLen){
         return ADT_INDEX_OUT_OF_BOUNDS_ERROR;
      }

      s32Destination = s32Index;
      s32Source = s32Index + s32Len;

      if (s32Source > self->s32CurLen) {
         return ADT_LENGTH_ERROR; //s32Len is too large
      }

      //call destructor on elements about to be removed
      if( (self->destructorEnable != 0) && (self->pDestructor != 0) ){
         for (i=0;i<s32Len; i++) {
            self->pDestructor(self->pFirst[s32Destination+i]);
         }
      }
      s32ElemsRemain = self->s32CurLen-s32Source;
      if (s32ElemsRemain > 0) {
         uint32_t u32BytesRemain;
         uint8_t* pDest;
         uint8_t* pSrc;
         pDest = (uint8_t*) &self->pFirst[s32Destination];
         pSrc = (uint8_t*) &self->pFirst[s32Source];
         u32BytesRemain = ((uint32_t)s32ElemsRemain) * ((uint32_t) ELEM_SIZE);
         adt_block_memmove(pDest, pSrc, u32BytesRemain);
      }
      self->s32CurLen-=s32Len;
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;

}